

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttp2connection.cpp
# Opt level: O1

void __thiscall QHttp2Stream::maybeResumeUpload(QHttp2Stream *this)

{
  uint uVar1;
  long *plVar2;
  bool bVar3;
  undefined8 uVar4;
  long lVar5;
  long lVar6;
  long in_FS_OFFSET;
  uint local_58 [6];
  char *local_40;
  QHashDummyValue local_31;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  qHttp2ConnectionLog();
  if (((byte)qHttp2ConnectionLog::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) !=
      0) {
    local_58[0] = 2;
    local_58[1] = 0;
    local_58[2] = 0;
    local_58[3] = 0;
    local_58[4] = 0;
    local_58[5] = 0;
    local_40 = qHttp2ConnectionLog::category.name;
    uVar4 = QMetaObject::cast((QObject *)&QHttp2Connection::staticMetaObject);
    uVar1 = *(uint *)(this + 0x10);
    plVar2 = *(long **)(this + 0x38);
    if (plVar2 == (long *)0x0) {
      lVar5 = 0;
    }
    else {
      lVar5 = (**(code **)(*plVar2 + 0x88))(plVar2);
      lVar6 = (**(code **)(**(long **)(this + 0x38) + 0x78))();
      lVar5 = lVar5 - lVar6;
    }
    bVar3 = isUploadBlocked(this);
    QMessageLogger::debug
              ((char *)local_58,
               "[%p] stream %u, maybeResumeUpload. Upload device: %p, bytes available: %lld, blocked? %d"
               ,uVar4,(ulong)uVar1,plVar2,lVar5,(uint)bVar3);
  }
  if (*(long *)(this + 0x38) != 0) {
    bVar3 = isUploadBlocked(this);
    if (!bVar3) {
      internalSendDATA(this);
      goto LAB_001e9890;
    }
  }
  lVar5 = QMetaObject::cast((QObject *)&QHttp2Connection::staticMetaObject);
  local_58[0] = *(uint *)(this + 0x10);
  QHash<unsigned_int,_QHashDummyValue>::emplace<QHashDummyValue>
            ((QHash<unsigned_int,_QHashDummyValue> *)(lVar5 + 0x1c8),local_58,&local_31);
LAB_001e9890:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QHttp2Stream::maybeResumeUpload()
{
    qCDebug(qHttp2ConnectionLog,
            "[%p] stream %u, maybeResumeUpload. Upload device: %p, bytes available: %lld, blocked? "
            "%d",
            getConnection(), m_streamID, m_uploadByteDevice,
            !m_uploadByteDevice ? 0 : m_uploadByteDevice->size() - m_uploadByteDevice->pos(),
            isUploadBlocked());
    if (isUploadingDATA() && !isUploadBlocked())
        internalSendDATA();
    else
        getConnection()->m_blockedStreams.insert(streamID());
}